

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnOpcode(BinaryReaderObjdump *this,Opcode opcode)

{
  pointer *ppIVar1;
  pointer __src;
  ulong uVar2;
  pointer pIVar3;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  
  (this->super_BinaryReaderObjdumpBase).current_opcode.enum_ = opcode.enum_;
  if (((this->reading_elem_init_expr_ == false) && (this->reading_data_init_expr_ == false)) &&
     (this->reading_global_init_expr_ == false)) {
    if ((this->reading_elem_expr_ & opcode.enum_ != End) == 0) {
      return (Result)Ok;
    }
  }
  else if (opcode.enum_ == End) {
    return (Result)Ok;
  }
  pIVar3 = (this->current_init_expr_).insts.
           super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar3 == (this->current_init_expr_).insts.
                super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __src = (this->current_init_expr_).insts.
            super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)pIVar3 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = ((long)__n >> 3) * -0x5555555555555555;
    uVar2 = 1;
    if (pIVar3 != __src) {
      uVar2 = uVar5;
    }
    uVar4 = uVar2 + uVar5;
    if (0x555555555555554 < uVar4) {
      uVar4 = 0x555555555555555;
    }
    if (CARRY8(uVar2,uVar5)) {
      uVar4 = 0x555555555555555;
    }
    if (uVar4 == 0) {
      pIVar3 = (pointer)0x0;
    }
    else {
      pIVar3 = (pointer)operator_new(uVar4 * 0x18);
    }
    (&pIVar3->opcode)[((long)__n >> 3) * 2].enum_ = opcode.enum_;
    if (0 < (long)__n) {
      memmove(pIVar3,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this->current_init_expr_).insts.
                                  super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    (this->current_init_expr_).insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_start = pIVar3;
    (this->current_init_expr_).insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pIVar3 + __n + 0x18);
    (this->current_init_expr_).insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar3 + uVar4;
  }
  else {
    (pIVar3->opcode).enum_ = opcode.enum_;
    ppIVar1 = &(this->current_init_expr_).insts.
               super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnOpcode(Opcode opcode) {
  BinaryReaderObjdumpBase::OnOpcode(opcode);
  if (ReadingInitExpr() && opcode != Opcode::End) {
    InitInst i;
    i.opcode = current_opcode;
    current_init_expr_.insts.push_back(i);
  }
  return Result::Ok;
}